

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_objects.cc
# Opt level: O2

void __thiscall
QPDF::readStream(QPDF *this,QPDFObjectHandle *object,QPDFObjGen og,qpdf_offset_t offset)

{
  long *plVar1;
  bool bVar2;
  qpdf_offset_t offset_00;
  longlong lVar3;
  QPDFExc *pQVar4;
  allocator<char> local_f9;
  size_t length;
  QPDFObjGen local_f0;
  QPDFObjectHandle length_obj;
  string local_d8;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_b8 [2];
  Token local_98;
  
  local_f0 = og;
  validateStreamLineEnd(this,object,og,offset);
  offset_00 = (**(code **)(**(long **)&(((this->m)._M_t.
                                         super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                                         .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl
                                        )->file).
                                       super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2> +
                          0x20))();
  length = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"/Length",(allocator<char> *)&local_d8);
  QPDFObjectHandle::getKey(&length_obj,(string *)object);
  std::__cxx11::string::~string((string *)&local_98);
  bVar2 = QPDFObjectHandle::isInteger(&length_obj);
  if (!bVar2) {
    bVar2 = QPDFObjectHandle::isNull(&length_obj);
    pQVar4 = (QPDFExc *)__cxa_allocate_exception(0x80);
    if (bVar2) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_98,"stream dictionary lacks /Length key",
                 (allocator<char> *)&local_d8);
      damagedPDF(pQVar4,this,offset,(string *)&local_98);
      __cxa_throw(pQVar4,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_98,"/Length key in stream dictionary is not an integer",
               (allocator<char> *)&local_d8);
    damagedPDF(pQVar4,this,offset,(string *)&local_98);
    __cxa_throw(pQVar4,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
  }
  length = QPDFObjectHandle::getUIntValue(&length_obj);
  plVar1 = *(long **)&(((this->m)._M_t.
                        super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                        .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->file).
                      super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>;
  (**(code **)(*plVar1 + 0x28))(plVar1,offset_00,0);
  plVar1 = *(long **)&(((this->m)._M_t.
                        super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                        .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->file).
                      super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>;
  lVar3 = QIntC::IntConverter<unsigned_long,_long_long,_false,_true>::convert(&length);
  (**(code **)(*plVar1 + 0x28))(plVar1,lVar3,1);
  readToken(&local_98,this,
            (((this->m)._M_t.
              super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
              super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
              super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->file).
            super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr,0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,"endstream",&local_f9);
  bVar2 = QPDFTokenizer::Token::isWord(&local_98,&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  QPDFTokenizer::Token::~Token(&local_98);
  if (bVar2) {
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&length_obj.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (local_b8,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)object);
    ::qpdf::Stream::Stream
              ((Stream *)&local_d8,this,local_f0,(QPDFObjectHandle *)local_b8,offset_00,length);
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&local_98,
               (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&local_d8);
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)object,
               (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&local_98);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_98.value);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_d8._M_string_length);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b8[0]._M_refcount);
    return;
  }
  pQVar4 = (QPDFExc *)__cxa_allocate_exception(0x80);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"expected endstream",(allocator<char> *)&local_d8);
  damagedPDF(pQVar4,this,(string *)&local_98);
  __cxa_throw(pQVar4,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
}

Assistant:

void
QPDF::readStream(QPDFObjectHandle& object, QPDFObjGen og, qpdf_offset_t offset)
{
    validateStreamLineEnd(object, og, offset);

    // Must get offset before accessing any additional objects since resolving a previously
    // unresolved indirect object will change file position.
    qpdf_offset_t stream_offset = m->file->tell();
    size_t length = 0;

    try {
        auto length_obj = object.getKey("/Length");

        if (!length_obj.isInteger()) {
            if (length_obj.isNull()) {
                QTC::TC("qpdf", "QPDF stream without length");
                throw damagedPDF(offset, "stream dictionary lacks /Length key");
            }
            QTC::TC("qpdf", "QPDF stream length not integer");
            throw damagedPDF(offset, "/Length key in stream dictionary is not an integer");
        }

        length = toS(length_obj.getUIntValue());
        // Seek in two steps to avoid potential integer overflow
        m->file->seek(stream_offset, SEEK_SET);
        m->file->seek(toO(length), SEEK_CUR);
        if (!readToken(*m->file).isWord("endstream")) {
            QTC::TC("qpdf", "QPDF missing endstream");
            throw damagedPDF("expected endstream");
        }
    } catch (QPDFExc& e) {
        if (m->attempt_recovery) {
            warn(e);
            length = recoverStreamLength(m->file, og, stream_offset);
        } else {
            throw;
        }
    }
    object = QPDFObjectHandle(qpdf::Stream(*this, og, object, stream_offset, length));
}